

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O1

InfoStatus
getLocalInfoValue(HighsLogOptions *report_log_options,string *name,bool valid,
                 vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,HighsInt *value)

{
  HighsInfoType type;
  pointer ppIVar1;
  InfoRecord *pIVar2;
  pointer pcVar3;
  InfoStatus IVar4;
  InfoStatus IVar5;
  HighsInt index;
  InfoRecordInt info;
  int local_b4;
  string local_b0;
  undefined1 local_90 [16];
  _Alloc_hider local_80 [2];
  char local_70 [16];
  _Alloc_hider local_60;
  char local_50 [16];
  bool local_40;
  _func_int **local_38;
  HighsInfoType local_30;
  
  IVar4 = getInfoIndex(report_log_options,name,info_records,&local_b4);
  IVar5 = kUnavailable;
  if (IVar4 != kOk) {
    IVar5 = IVar4;
  }
  if (IVar4 == kOk && valid) {
    ppIVar1 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    type = ppIVar1[local_b4]->type;
    if (type == kInt) {
      pIVar2 = ppIVar1[local_b4];
      local_90._0_8_ = &PTR__InfoRecord_00448ca8;
      local_90._8_4_ = pIVar2->type;
      local_80[0]._M_p = local_70;
      pcVar3 = (pIVar2->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar3,pcVar3 + (pIVar2->name)._M_string_length);
      local_60._M_p = local_50;
      pcVar3 = (pIVar2->description)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar3,pcVar3 + (pIVar2->description)._M_string_length);
      local_40 = pIVar2->advanced;
      local_90._0_8_ = &PTR__InfoRecord_00448c60;
      local_38 = pIVar2[1]._vptr_InfoRecord;
      local_30 = pIVar2[1].type;
      *value = *(HighsInt *)local_38;
      InfoRecord::~InfoRecord((InfoRecord *)local_90);
      IVar5 = kOk;
    }
    else {
      local_90._0_8_ = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"HighsInt","");
      pcVar3 = (name->_M_dataplus)._M_p;
      infoEntryTypeToString_abi_cxx11_(&local_b0,type);
      highsLogUser(report_log_options,kError,
                   "getInfoValue: Info \"%s\" requires value of type %s, not %s\n",pcVar3,
                   local_b0._M_dataplus._M_p,local_90._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((_Alloc_hider *)local_90._0_8_ != local_80) {
        operator_delete((void *)local_90._0_8_);
      }
      IVar5 = kIllegalValue;
    }
  }
  return IVar5;
}

Assistant:

InfoStatus getLocalInfoValue(const HighsLogOptions& report_log_options,
                             const std::string& name, const bool valid,
                             const std::vector<InfoRecord*>& info_records,
                             HighsInt& value) {
  HighsInt index;
  InfoStatus status =
      getInfoIndex(report_log_options, name, info_records, index);
  if (status != InfoStatus::kOk) return status;
  if (!valid) return InfoStatus::kUnavailable;
  HighsInfoType type = info_records[index]->type;
  bool type_ok = type == HighsInfoType::kInt;
  // When HIGHSINT64 is "on", value is int64_t and this method is used
  // get HighsInfo values of type HighsInfoType::kInt64
#ifdef HIGHSINT64
  type_ok = type_ok || type == HighsInfoType::kInt64;
#endif
  if (!type_ok) {
    std::string illegal_type = "HighsInt";
#ifdef HIGHSINT64
    illegal_type += " or int64_t";
#endif
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "getInfoValue: Info \"%s\" requires value of type %s, not %s\n",
        name.c_str(), infoEntryTypeToString(type).c_str(),
        illegal_type.c_str());
    return InfoStatus::kIllegalValue;
  }
  if (type == HighsInfoType::kInt) {
    InfoRecordInt info = ((InfoRecordInt*)info_records[index])[0];
    value = *info.value;
  } else {
    assert(type == HighsInfoType::kInt64);
    InfoRecordInt64 info = ((InfoRecordInt64*)info_records[index])[0];
    value = *info.value;
  }
  return InfoStatus::kOk;
}